

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.c
# Opt level: O0

void check_byte_count(dmr_C *C,instruction *insn,pseudo_t count)

{
  symbol *psVar1;
  undefined8 uVar2;
  unsigned_long_long val;
  pseudo_t count_local;
  instruction *insn_local;
  dmr_C *C_local;
  
  if ((((count != (pseudo_t)0x0) && (count->type == PSEUDO_VAL)) &&
      (psVar1 = (count->field_5).sym, C->Wmemcpy_max_count != 0)) &&
     ((symbol *)C->fmemcpy_max_count < psVar1)) {
    uVar2 = dmrC_show_ident(C,((insn->field_6).field_1.bb_true)->parents->allocator_);
    dmrC_warning(C,insn->pos,"%s with byte count of %llu",uVar2,psVar1);
  }
  return;
}

Assistant:

static void check_byte_count(struct dmr_C *C, struct instruction *insn, pseudo_t count)
{
	if (!count)
		return;
	if (count->type == PSEUDO_VAL) {
		unsigned long long val = count->value;
		if (C->Wmemcpy_max_count && val > C->fmemcpy_max_count)
			dmrC_warning(C, insn->pos, "%s with byte count of %llu",
				dmrC_show_ident(C, insn->func->sym->ident), val);
		return;
	}
	/* OK, we could try to do the range analysis here */
}